

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void __thiscall edition_unittest::TestAllTypes::Clear(TestAllTypes *this)

{
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *pRVar2;
  RepeatedField<unsigned_int> *pRVar3;
  RepeatedField<unsigned_long> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  uint uVar5;
  ulong uVar6;
  TestAllTypes_OptionalGroup *this_03;
  TestAllTypes_NestedMessage *pTVar7;
  ForeignMessage *this_04;
  ImportMessage *this_05;
  PublicImportMessage *this_06;
  anon_union_888_1_493b367e_for_TestAllTypes_11 aVar8;
  int iVar9;
  undefined8 *puVar10;
  char *failure_msg;
  Arena *pAVar11;
  char *file;
  bool bVar12;
  LogMessageFatal local_30;
  
  pRVar1 = &(this->field_0)._impl_.repeated_int32_;
  aVar8 = this->field_0;
  if (((undefined1  [888])aVar8 & (undefined1  [888])0x4) != (undefined1  [888])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = ((undefined1  [888])aVar8 & (undefined1  [888])0x4) == (undefined1  [888])0x0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size
            (pRVar1,((undefined1  [888])aVar8 & (undefined1  [888])0x4) == (undefined1  [888])0x0,0)
  ;
  pRVar2 = &(this->field_0)._impl_.repeated_int64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x28);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar2,(uVar6 & 4) == 0,0);
  pRVar3 = &(this->field_0)._impl_.repeated_uint32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x40);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar3->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size(pRVar3,(uVar6 & 4) == 0,0);
  pRVar4 = &(this->field_0)._impl_.repeated_uint64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x58);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar4->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar4,(uVar6 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_sint32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x70);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  pRVar2 = &(this->field_0)._impl_.repeated_sint64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x88);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar2,(uVar6 & 4) == 0,0);
  pRVar3 = &(this->field_0)._impl_.repeated_fixed32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xa0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar3->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size(pRVar3,(uVar6 & 4) == 0,0);
  pRVar4 = &(this->field_0)._impl_.repeated_fixed64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xb0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar4->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar4,(uVar6 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_sfixed32_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xc0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  pRVar2 = &(this->field_0)._impl_.repeated_sfixed64_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xd0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar2,(uVar6 & 4) == 0,0);
  this_00 = &(this->field_0)._impl_.repeated_float_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xe0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  google::protobuf::RepeatedField<float>::set_size(this_00,(uVar6 & 4) == 0,0);
  this_01 = &(this->field_0)._impl_.repeated_double_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0xf0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  google::protobuf::RepeatedField<double>::set_size(this_01,(uVar6 & 4) == 0,0);
  this_02 = &(this->field_0)._impl_.repeated_bool_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x100);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  google::protobuf::RepeatedField<bool>::set_size(this_02,(uVar6 & 4) == 0,0);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_RepeatedGroup>>
            (&(this->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_NestedMessage>>
            (&(this->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
            (&(this->field_0)._impl_.repeated_foreign_message_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
            (&(this->field_0)._impl_.repeated_import_message_.super_RepeatedPtrFieldBase);
  pRVar1 = &(this->field_0)._impl_.repeated_nested_enum_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x1a0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_foreign_enum_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x1b8);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_import_enum_;
  uVar6 = *(ulong *)((long)&this->field_0 + 0x1d0);
  if ((uVar6 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar12 = (uVar6 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  iVar9 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar12);
  if ((iVar9 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar6 & 4) == 0,0);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_string_piece_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeated_cord_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_NestedMessage>>
            (&(this->field_0)._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase);
  uVar5 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((char)uVar5 != '\0') {
    if ((uVar5 & 1) != 0) {
      uVar6 = *(ulong *)((long)&this->field_0 + 0x230);
      if ((uVar6 & 3) != 0) {
        puVar10 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
        puVar10[1] = 0;
        *(undefined1 *)*puVar10 = 0;
        goto LAB_00c1eaf2;
      }
LAB_00c1ee1b:
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
      ;
      failure_msg = "!tagged_ptr_.IsDefault()";
      iVar9 = 0x20b;
      goto LAB_00c1ee36;
    }
LAB_00c1eaf2:
    if ((uVar5 & 2) != 0) {
      uVar6 = *(ulong *)((long)&this->field_0 + 0x238);
      if ((uVar6 & 3) == 0) goto LAB_00c1ee1b;
      puVar10 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
      puVar10[1] = 0;
      *(undefined1 *)*puVar10 = 0;
    }
    if ((uVar5 & 4) != 0) {
      uVar6 = *(ulong *)((long)&this->field_0 + 0x240);
      if ((uVar6 & 3) == 0) goto LAB_00c1ee1b;
      puVar10 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
      puVar10[1] = 0;
      *(undefined1 *)*puVar10 = 0;
    }
    if ((uVar5 & 8) != 0) {
      uVar6 = *(ulong *)((long)&this->field_0 + 0x248);
      if ((uVar6 & 3) == 0) goto LAB_00c1ee1b;
      puVar10 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
      puVar10[1] = 0;
      *(undefined1 *)*puVar10 = 0;
    }
    if ((uVar5 & 0x10) != 0) {
      this_03 = (this->field_0)._impl_.optionalgroup_;
      if (this_03 == (TestAllTypes_OptionalGroup *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
        ;
        failure_msg = "_impl_.optionalgroup_ != nullptr";
        iVar9 = 0x23fa;
        goto LAB_00c1ee36;
      }
      TestAllTypes_OptionalGroup::Clear(this_03);
    }
    if ((uVar5 & 0x20) != 0) {
      pTVar7 = (this->field_0)._impl_.optional_nested_message_;
      if (pTVar7 == (TestAllTypes_NestedMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
        ;
        failure_msg = "_impl_.optional_nested_message_ != nullptr";
        iVar9 = 0x23fe;
        goto LAB_00c1ee36;
      }
      TestAllTypes_NestedMessage::Clear(pTVar7);
    }
    if ((uVar5 & 0x40) != 0) {
      this_04 = (this->field_0)._impl_.optional_foreign_message_;
      if (this_04 == (ForeignMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
        ;
        failure_msg = "_impl_.optional_foreign_message_ != nullptr";
        iVar9 = 0x2402;
        goto LAB_00c1ee36;
      }
      ForeignMessage::Clear(this_04);
    }
    if ((char)uVar5 < '\0') {
      this_05 = (this->field_0)._impl_.optional_import_message_;
      if (this_05 == (ImportMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
        ;
        failure_msg = "_impl_.optional_import_message_ != nullptr";
        iVar9 = 0x2406;
        goto LAB_00c1ee36;
      }
      proto2_unittest_import::ImportMessage::Clear(this_05);
    }
  }
  if ((uVar5 & 0x700) != 0) {
    if ((uVar5 >> 8 & 1) != 0) {
      this_06 = (this->field_0)._impl_.optional_public_import_message_;
      if (this_06 == (PublicImportMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
        ;
        failure_msg = "_impl_.optional_public_import_message_ != nullptr";
        iVar9 = 0x240c;
        goto LAB_00c1ee36;
      }
      proto2_unittest_import::PublicImportMessage::Clear(this_06);
    }
    if ((uVar5 >> 9 & 1) != 0) {
      pTVar7 = (this->field_0)._impl_.optional_lazy_message_;
      if (pTVar7 == (TestAllTypes_NestedMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
        ;
        failure_msg = "_impl_.optional_lazy_message_ != nullptr";
        iVar9 = 0x2410;
        goto LAB_00c1ee36;
      }
      TestAllTypes_NestedMessage::Clear(pTVar7);
    }
    if ((uVar5 >> 10 & 1) != 0) {
      pTVar7 = (this->field_0)._impl_.optional_unverified_lazy_message_;
      if (pTVar7 == (TestAllTypes_NestedMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
        ;
        failure_msg = "_impl_.optional_unverified_lazy_message_ != nullptr";
        iVar9 = 0x2414;
LAB_00c1ee36:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_30,file,iVar9,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
      }
      TestAllTypes_NestedMessage::Clear(pTVar7);
    }
  }
  if ((uVar5 & 0xf800) != 0) {
    (this->field_0)._impl_.optional_uint64_ = 0;
    (this->field_0)._impl_.optional_sint64_ = 0;
    (this->field_0)._impl_.optional_int64_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x290) = 0;
  }
  if ((uVar5 & 0xff0000) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x2c1) = 0;
    *(undefined8 *)((long)&(this->field_0)._impl_.optional_double_ + 1) = 0;
    (this->field_0)._impl_.optional_sfixed64_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x2c0) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x2a8) = 0;
    (this->field_0)._impl_.optional_fixed64_ = 0;
  }
  if (0xffffff < uVar5) {
    *(undefined8 *)((long)&this->field_0 + 0x2d4) = 0x100000007;
    (this->field_0)._impl_.optional_foreign_enum_ = 4;
    if ((uVar5 >> 0x1b & 1) != 0) {
      pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_string_,
                 (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_default_string_,
                 pAVar11);
    }
    if ((uVar5 >> 0x1c & 1) != 0) {
      pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_bytes_,
                 (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_default_bytes_,
                 pAVar11);
    }
    if ((uVar5 >> 0x1d & 1) != 0) {
      pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_string_piece_,
                 (LazyString *)
                 Impl_::_i_give_permission_to_break_this_code_default_default_string_piece_,pAVar11)
      ;
    }
    if ((uVar5 >> 0x1e & 1) != 0) {
      pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::ClearToDefault
                (&(this->field_0)._impl_.default_cord_,
                 (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_default_cord_,
                 pAVar11);
    }
    if ((int)uVar5 < 0) {
      absl::lts_20250127::Cord::Clear(&(this->field_0)._impl_.optional_bytes_cord_);
    }
  }
  uVar5 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  if ((char)uVar5 != '\0') {
    (this->field_0)._impl_.default_int64_ = 0x2a;
    (this->field_0)._impl_.default_int32_ = 0x29;
    (this->field_0)._impl_.default_uint32_ = 0x2b;
    (this->field_0)._impl_.default_uint64_ = 0x2c;
    (this->field_0)._impl_.default_sint64_ = 0x2e;
    (this->field_0)._impl_.default_sint32_ = -0x2d;
    (this->field_0)._impl_.default_fixed32_ = 0x2f;
    (this->field_0)._impl_.default_fixed64_ = 0x30;
  }
  if ((uVar5 & 0xff00) != 0) {
    (this->field_0)._impl_.default_sfixed64_ = -0x32;
    *(undefined8 *)((long)&this->field_0 + 0x348) = 0x424e000000000031;
    (this->field_0)._impl_.default_double_ = (double)&DAT_40e9640000000000;
    (this->field_0)._impl_.default_bool_ = true;
    *(undefined8 *)((long)&this->field_0 + 0x35c) = 0x500000002;
    (this->field_0)._impl_.default_import_enum_ = 8;
  }
  clear_oneof_field(this);
  *(undefined8 *)(this->field_0)._impl_._has_bits_.has_bits_ = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_int32_.Clear();
  _impl_.repeated_int64_.Clear();
  _impl_.repeated_uint32_.Clear();
  _impl_.repeated_uint64_.Clear();
  _impl_.repeated_sint32_.Clear();
  _impl_.repeated_sint64_.Clear();
  _impl_.repeated_fixed32_.Clear();
  _impl_.repeated_fixed64_.Clear();
  _impl_.repeated_sfixed32_.Clear();
  _impl_.repeated_sfixed64_.Clear();
  _impl_.repeated_float_.Clear();
  _impl_.repeated_double_.Clear();
  _impl_.repeated_bool_.Clear();
  _impl_.repeated_string_.Clear();
  _impl_.repeated_bytes_.Clear();
  _impl_.repeatedgroup_.Clear();
  _impl_.repeated_nested_message_.Clear();
  _impl_.repeated_foreign_message_.Clear();
  _impl_.repeated_import_message_.Clear();
  _impl_.repeated_nested_enum_.Clear();
  _impl_.repeated_foreign_enum_.Clear();
  _impl_.repeated_import_enum_.Clear();
  _impl_.repeated_string_piece_.Clear();
  _impl_.repeated_cord_.Clear();
  _impl_.repeated_lazy_message_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.optional_string_piece_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.optional_cord_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.optionalgroup_ != nullptr);
      _impl_.optionalgroup_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.optional_nested_message_ != nullptr);
      _impl_.optional_nested_message_->Clear();
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(_impl_.optional_foreign_message_ != nullptr);
      _impl_.optional_foreign_message_->Clear();
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(_impl_.optional_import_message_ != nullptr);
      _impl_.optional_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(_impl_.optional_public_import_message_ != nullptr);
      _impl_.optional_public_import_message_->Clear();
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_message_ != nullptr);
      _impl_.optional_lazy_message_->Clear();
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(_impl_.optional_unverified_lazy_message_ != nullptr);
      _impl_.optional_unverified_lazy_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000f800u) != 0) {
    ::memset(&_impl_.optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_sint64_) -
        reinterpret_cast<char*>(&_impl_.optional_int64_)) + sizeof(_impl_.optional_sint64_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.optional_sint32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_bool_) -
        reinterpret_cast<char*>(&_impl_.optional_sint32_)) + sizeof(_impl_.optional_bool_));
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    _impl_.optional_import_enum_ = 7;
    _impl_.optional_nested_enum_ = 1;
    _impl_.optional_foreign_enum_ = 4;
    if ((cached_has_bits & 0x08000000u) != 0) {
      _impl_.default_string_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_string_, GetArena());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _impl_.default_bytes_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_bytes_, GetArena());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      _impl_.default_string_piece_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_string_piece_, GetArena());
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _impl_.default_cord_.ClearToDefault(::edition_unittest::TestAllTypes::Impl_::_i_give_permission_to_break_this_code_default_default_cord_, GetArena());
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _impl_.optional_bytes_cord_.Clear();
    }
  }
  cached_has_bits = _impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    _impl_.default_int64_ = ::int64_t{42};
    _impl_.default_int32_ = 41;
    _impl_.default_uint32_ = 43u;
    _impl_.default_uint64_ = ::uint64_t{44u};
    _impl_.default_sint64_ = ::int64_t{46};
    _impl_.default_sint32_ = -45;
    _impl_.default_fixed32_ = 47u;
    _impl_.default_fixed64_ = ::uint64_t{48u};
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    _impl_.default_sfixed64_ = ::int64_t{-50};
    _impl_.default_sfixed32_ = 49;
    _impl_.default_float_ = 51.5f;
    _impl_.default_double_ = 52000;
    _impl_.default_bool_ = true;
    _impl_.default_nested_enum_ = 2;
    _impl_.default_foreign_enum_ = 5;
    _impl_.default_import_enum_ = 8;
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}